

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O1

bool __thiscall
cmFunctionHelperCommand::InvokeInitialPass
          (cmFunctionHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  cmMakefile *pcVar1;
  bool bVar2;
  byte bVar3;
  pointer pbVar4;
  pointer pcVar5;
  byte bVar6;
  ulong uVar7;
  cmMakefile *unaff_R12;
  uint uVar8;
  ulong uVar9;
  cmExecutionStatus status;
  string argnDef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  FunctionPushPop functionScope;
  string argvDef;
  ostringstream strStream;
  undefined1 local_398 [8];
  const_iterator local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  cmExecutionStatus *local_338;
  FunctionPushPop local_330;
  string local_320 [3];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338 = inStatus;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_358,(char *)0x0);
  if ((ulong)((long)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Function invoked with incorrect arguments for function named: ",
               "");
    std::__cxx11::string::_M_append
              ((char *)local_1a8,
               (ulong)(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    cmCommand::SetError(&this->super_cmCommand,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    bVar6 = 0;
  }
  else {
    cmMakefile::FunctionPushPop::FunctionPushPop
              (&local_330,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    pcVar1 = (this->super_cmCommand).Makefile;
    local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"ARGC","");
    std::__cxx11::stringbuf::str();
    cmMakefile::AddDefinition(pcVar1,local_320,local_378._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"ARGC","");
    cmMakefile::MarkVariableAsUsed(pcVar1,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    if (local_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = 0;
      uVar9 = 1;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"ARGV",4);
        std::ostream::_M_insert<unsigned_long>((ulong)local_320);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition
                  (pcVar1,&local_378,
                   local_358.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        unaff_R12 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::MarkVariableAsUsed(unaff_R12,&local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        bVar2 = uVar9 < (ulong)((long)local_358.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_358.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar7 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
    }
    pbVar4 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)(this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4)) {
      uVar7 = 1;
      uVar8 = 2;
      do {
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,pbVar4 + uVar7,
                   local_358.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8 - 2]._M_dataplus._M_p);
        uVar7 = (ulong)uVar8;
        pbVar4 = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 1;
      } while (uVar7 < (ulong)((long)(this->Args).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)
              );
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (local_320,&local_358,";");
    local_398 = (undefined1  [8])
                ((long)local_358.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                (long)(this->Args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish +
                (-0x20 - (long)(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
    local_390._M_current =
         local_358.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_378,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_398,";");
    pcVar1 = (this->super_cmCommand).Makefile;
    local_398 = (undefined1  [8])&local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"ARGV","");
    cmMakefile::AddDefinition(pcVar1,(string *)local_398,local_320[0]._M_dataplus._M_p);
    if (local_398 != (undefined1  [8])&local_388) {
      operator_delete((void *)local_398,local_388._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    local_398 = (undefined1  [8])&local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"ARGV","");
    cmMakefile::MarkVariableAsUsed(pcVar1,(string *)local_398);
    if (local_398 != (undefined1  [8])&local_388) {
      operator_delete((void *)local_398,local_388._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    local_398 = (undefined1  [8])&local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"ARGN","");
    cmMakefile::AddDefinition(pcVar1,(string *)local_398,local_378._M_dataplus._M_p);
    if (local_398 != (undefined1  [8])&local_388) {
      operator_delete((void *)local_398,local_388._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    local_398 = (undefined1  [8])&local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"ARGN","");
    cmMakefile::MarkVariableAsUsed(pcVar1,(string *)local_398);
    if (local_398 != (undefined1  [8])&local_388) {
      operator_delete((void *)local_398,local_388._M_allocated_capacity + 1);
    }
    pcVar5 = (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar6 = 1;
    if ((this->Functions).
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar5) {
      uVar7 = 0;
      uVar9 = 1;
      do {
        local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
        bVar2 = cmMakefile::ExecuteCommand
                          ((this->super_cmCommand).Makefile,pcVar5 + uVar7,
                           (cmExecutionStatus *)local_398);
        if ((bVar2) && (local_398[3] != true)) {
          unaff_R12 = (cmMakefile *)(ulong)(byte)((byte)unaff_R12 | (byte)local_398[0]);
          bVar3 = (byte)local_398[0] ^ 1;
        }
        else {
          local_330.ReportError = false;
          local_338->NestedError = true;
          bVar3 = 0;
          unaff_R12 = (cmMakefile *)0x0;
        }
        bVar6 = (byte)unaff_R12;
        if (bVar3 == 0) break;
        pcVar5 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        bVar2 = uVar9 < (ulong)((long)(this->Functions).
                                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar5 >> 6
                               );
        uVar7 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
        bVar6 = 1;
      } while (bVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmMakefile::FunctionPushPop::~FunctionPushPop(&local_330);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmFunctionHelperCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus& inStatus)
{
  // Expand the argument list to the function.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      "Function invoked with incorrect arguments for function named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
  }

  cmMakefile::FunctionPushPop functionScope(this->Makefile, this->FilePath,
                                            this->Policies);

  // set the value of argc
  std::ostringstream strStream;
  strStream << expandedArgs.size();
  this->Makefile->AddDefinition("ARGC", strStream.str().c_str());
  this->Makefile->MarkVariableAsUsed("ARGC");

  // set the values for ARGV0 ARGV1 ...
  for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
    std::ostringstream tmpStream;
    tmpStream << "ARGV" << t;
    this->Makefile->AddDefinition(tmpStream.str(), expandedArgs[t].c_str());
    this->Makefile->MarkVariableAsUsed(tmpStream.str());
  }

  // define the formal arguments
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    this->Makefile->AddDefinition(this->Args[j], expandedArgs[j - 1].c_str());
  }

  // define ARGV and ARGN
  std::string argvDef = cmJoin(expandedArgs, ";");
  std::vector<std::string>::const_iterator eit =
    expandedArgs.begin() + (this->Args.size() - 1);
  std::string argnDef = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  this->Makefile->AddDefinition("ARGV", argvDef.c_str());
  this->Makefile->MarkVariableAsUsed("ARGV");
  this->Makefile->AddDefinition("ARGN", argnDef.c_str());
  this->Makefile->MarkVariableAsUsed("ARGN");

  // Invoke all the functions that were collected in the block.
  // for each function
  for (unsigned int c = 0; c < this->Functions.size(); ++c) {
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(this->Functions[c], status) ||
        status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      functionScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      return true;
    }
  }

  // pop scope on the makefile
  return true;
}